

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O0

SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_Eigen::Block<Eigen::Matrix<std::complex<double>,_2,_2,_0,_2,_2>,_2,_1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
* __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,std::complex<double>>,Eigen::Block<Eigen::Matrix<std::complex<double>,2,2,0,2,2>,2,1,true>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,2,1,0,2,1>>>
::
lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,2,1,0,2,1>>>
          (SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_Eigen::Block<Eigen::Matrix<std::complex<double>,_2,_2,_0,_2,_2>,_2,_1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
           *this,DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
                 *rhs)

{
  Index IVar1;
  Index IVar2;
  SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_Eigen::Block<Eigen::Matrix<std::complex<double>,_2,_2,_0,_2,_2>,_2,_1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
  *pSVar3;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
  *in_RSI;
  SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_Eigen::Block<Eigen::Matrix<std::complex<double>,_2,_2,_0,_2,_2>,_2,_1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
  *in_RDI;
  bool bVar4;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
  *in_stack_ffffffffffffffc8;
  SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_Eigen::Block<Eigen::Matrix<std::complex<double>,_2,_2,_0,_2,_2>,_2,_1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
  *in_stack_ffffffffffffffd0;
  
  IVar1 = SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_Eigen::Block<Eigen::Matrix<std::complex<double>,_2,_2,_0,_2,_2>,_2,_1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
          ::rows((SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_Eigen::Block<Eigen::Matrix<std::complex<double>,_2,_2,_0,_2,_2>,_2,_1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
                  *)0x318bed);
  IVar2 = EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
          ::rows((EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
                  *)0x318bfc);
  bVar4 = false;
  if (IVar1 == IVar2) {
    in_stack_ffffffffffffffd0 =
         (SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_Eigen::Block<Eigen::Matrix<std::complex<double>,_2,_2,_0,_2,_2>,_2,_1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
          *)SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_Eigen::Block<Eigen::Matrix<std::complex<double>,_2,_2,_0,_2,_2>,_2,_1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
            ::cols((SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_Eigen::Block<Eigen::Matrix<std::complex<double>,_2,_2,_0,_2,_2>,_2,_1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
                    *)0x318c19);
    pSVar3 = (SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_Eigen::Block<Eigen::Matrix<std::complex<double>,_2,_2,_0,_2,_2>,_2,_1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
              *)EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
                ::cols((EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
                        *)0x318c28);
    bVar4 = in_stack_ffffffffffffffd0 == pSVar3;
  }
  if (!bVar4) {
    __assert_fail("rows() == rhs.rows() && cols() == rhs.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/SelfCwiseBinaryOp.h"
                  ,0x88,
                  "SelfCwiseBinaryOp<BinOp, Lhs, Rhs> &Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>>, Eigen::Block<Eigen::Matrix<std::complex<double>, 2, 2>, 2, 1, true>, Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>>, Eigen::Matrix<std::complex<double>, 2, 1>>>::lazyAssign(const DenseBase<RhsDerived> &) [BinaryOp = Eigen::internal::scalar_quotient_op<std::complex<double>>, Lhs = Eigen::Block<Eigen::Matrix<std::complex<double>, 2, 2>, 2, 1, true>, Rhs = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>>, Eigen::Matrix<std::complex<double>, 2, 1>>, RhsDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>>, Eigen::Matrix<std::complex<double>, 2, 1>>]"
                 );
  }
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
  ::derived(in_RSI);
  internal::
  assign_impl<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_Eigen::Block<Eigen::Matrix<std::complex<double>,_2,_2,_0,_2,_2>,_2,_1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>,_1,_2,_0>
  ::run(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
  ::derived(in_RSI);
  DenseBase<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,std::complex<double>>,Eigen::Block<Eigen::Matrix<std::complex<double>,2,2,0,2,2>,2,1,true>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,2,1,0,2,1>>>>
  ::
  checkTransposeAliasing<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,2,1,0,2,1>>>
            ((DenseBase<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_Eigen::Block<Eigen::Matrix<std::complex<double>,_2,_2,_0,_2,_2>,_2,_1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>_>
              *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

EIGEN_STRONG_INLINE SelfCwiseBinaryOp& lazyAssign(const DenseBase<RhsDerived>& rhs)
    {
      EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(Lhs,RhsDerived)
      EIGEN_CHECK_BINARY_COMPATIBILIY(BinaryOp,typename Lhs::Scalar,typename RhsDerived::Scalar);
      
    #ifdef EIGEN_DEBUG_ASSIGN
      internal::assign_traits<SelfCwiseBinaryOp, RhsDerived>::debug();
    #endif
      eigen_assert(rows() == rhs.rows() && cols() == rhs.cols());
      internal::assign_impl<SelfCwiseBinaryOp, RhsDerived>::run(*this,rhs.derived());
    #ifndef EIGEN_NO_DEBUG
      this->checkTransposeAliasing(rhs.derived());
    #endif
      return *this;
    }